

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_engine_base.cpp
# Opt level: O3

void __thiscall zmq::stream_engine_base_t::unplug(stream_engine_base_t *this)

{
  if (this->_plugged == false) {
    unplug();
  }
  this->_plugged = false;
  if (this->_has_handshake_timer == true) {
    io_object_t::cancel_timer(&this->super_io_object_t,0x40);
    this->_has_handshake_timer = false;
  }
  if (this->_has_ttl_timer == true) {
    io_object_t::cancel_timer(&this->super_io_object_t,0x82);
    this->_has_ttl_timer = false;
  }
  if (this->_has_timeout_timer == true) {
    io_object_t::cancel_timer(&this->super_io_object_t,0x81);
    this->_has_timeout_timer = false;
  }
  if (this->_has_heartbeat_timer == true) {
    io_object_t::cancel_timer(&this->super_io_object_t,0x80);
    this->_has_heartbeat_timer = false;
  }
  if (this->_io_error == false) {
    io_object_t::rm_fd(&this->super_io_object_t,this->_handle);
  }
  io_object_t::unplug(&this->super_io_object_t);
  this->_session = (session_base_t *)0x0;
  return;
}

Assistant:

void zmq::stream_engine_base_t::unplug ()
{
    zmq_assert (_plugged);
    _plugged = false;

    //  Cancel all timers.
    if (_has_handshake_timer) {
        cancel_timer (handshake_timer_id);
        _has_handshake_timer = false;
    }

    if (_has_ttl_timer) {
        cancel_timer (heartbeat_ttl_timer_id);
        _has_ttl_timer = false;
    }

    if (_has_timeout_timer) {
        cancel_timer (heartbeat_timeout_timer_id);
        _has_timeout_timer = false;
    }

    if (_has_heartbeat_timer) {
        cancel_timer (heartbeat_ivl_timer_id);
        _has_heartbeat_timer = false;
    }
    //  Cancel all fd subscriptions.
    if (!_io_error)
        rm_fd (_handle);

    //  Disconnect from I/O threads poller object.
    io_object_t::unplug ();

    _session = NULL;
}